

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformation_t *
opengv::point_cloud::threept_arun(PointCloudAdapterBase *adapter,Indices *indices)

{
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar1;
  int iVar2;
  TransposeReturnType other;
  Indices *in_RDX;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RSI;
  transformation_t *in_RDI;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  PVar3;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar4;
  translation_t translation;
  rotation_t rotation;
  MatrixXd *in_stack_00000198;
  Vector3d fprime;
  Vector3d f;
  size_t i_1;
  MatrixXd Hcross;
  size_t i;
  point_t pointsCenter2;
  point_t pointsCenter1;
  size_t numberCorrespondences;
  transformation_t *solution;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffffca8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffcb0;
  RhsNested in_stack_fffffffffffffcb8;
  LhsNested in_stack_fffffffffffffcc0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffcc8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  unsigned_long *scalar;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd08;
  undefined1 local_1c0 [72];
  undefined1 local_178 [72];
  ulong local_130;
  undefined4 local_108;
  undefined4 local_104;
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  ulong local_78;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_60 [64];
  size_t local_20 [2];
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_10;
  
  local_10 = in_RSI;
  local_20[0] = Indices::size(in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcb0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffca8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcb0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffca8);
  for (local_78 = 0; pMVar1 = local_10, local_78 < local_20[0]; local_78 = local_78 + 1) {
    iVar2 = Indices::operator[]((Indices *)in_stack_fffffffffffffcb8.m_matrix,
                                (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    (**(code **)(*(long *)pMVar1 + 0x10))(local_90,pMVar1,(long)iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    pMVar1 = local_10;
    iVar2 = Indices::operator[]((Indices *)in_stack_fffffffffffffcb8.m_matrix,
                                (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    (**(code **)(*(long *)pMVar1 + 0x18))(local_a8,pMVar1,(long)iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  }
  scalar = local_20;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(in_stack_fffffffffffffd08,scalar);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffca8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(local_60,scalar);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcb0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffca8);
  local_104 = 3;
  local_108 = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffcd0,
             (int *)in_stack_fffffffffffffcc8,(int *)in_stack_fffffffffffffcc0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8);
  PVar3.m_rhs.m_matrix = in_stack_fffffffffffffcb8.m_matrix;
  PVar3.m_lhs = in_stack_fffffffffffffcc0;
  for (local_130 = 0; pMVar1 = local_10, local_130 < local_20[0]; local_130 = local_130 + 1) {
    iVar2 = Indices::operator[]((Indices *)PVar3.m_rhs.m_matrix.m_matrix,
                                (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    (**(code **)(*(long *)pMVar1 + 0x10))(local_178,pMVar1,(long)iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               in_stack_fffffffffffffcd0);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcb0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffca8);
    in_stack_fffffffffffffcd0 = local_10;
    in_stack_fffffffffffffcdc =
         Indices::operator[]((Indices *)PVar3.m_rhs.m_matrix.m_matrix,
                             (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
    (**(code **)(*(long *)in_stack_fffffffffffffcd0 + 0x18))
              (local_1c0,in_stack_fffffffffffffcd0,(long)in_stack_fffffffffffffcdc);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
               in_stack_fffffffffffffcd0);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffcb0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffca8);
    other = Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                      ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffca8
                      );
    PVar3 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                      (in_stack_fffffffffffffcb0,
                       (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                       in_stack_fffffffffffffca8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffcd0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)other.m_matrix);
  }
  math::arun(in_stack_00000198);
  PVar4 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffcb0,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffca8)
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_stack_fffffffffffffcd0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)PVar4.m_lhs,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)PVar4.m_rhs);
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x302a6c);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)PVar3.m_lhs,
             (Index)PVar3.m_rhs.m_matrix.m_matrix,(Index)PVar4.m_lhs);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)PVar4.m_lhs,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)PVar4.m_rhs);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)PVar3.m_lhs,
             (Index)PVar3.m_rhs.m_matrix.m_matrix);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)PVar4.m_lhs,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar4.m_rhs);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x302ae3);
  return in_RDI;
}

Assistant:

transformation_t threept_arun(
    const PointCloudAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 2);

  //derive the centroid of the two point-clouds
  point_t pointsCenter1 = Eigen::Vector3d::Zero();
  point_t pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getPoint1(indices[i]);
    pointsCenter2 += adapter.getPoint2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  //compute the matrix H = sum(f'*f^{T})
  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f = adapter.getPoint1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime = adapter.getPoint2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  //decompose this matrix (SVD) to obtain rotation
  rotation_t rotation = math::arun(Hcross);
  translation_t translation = pointsCenter1 - rotation*pointsCenter2;
  transformation_t solution;
  solution.block<3,3>(0,0) = rotation;
  solution.col(3) = translation;

  return solution;
}